

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O3

int run_test_ipc_listen_before_write(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  undefined8 *extraout_RDX;
  code *pcVar3;
  ulong uVar4;
  char *helper;
  uv_process_t uStack_a0;
  
  helper = "ipc_helper_listen_before_write";
  pcVar3 = on_read;
  run_ipc_test("ipc_helper_listen_before_write",on_read);
  if (local_conn_accepted == '\0') {
    run_test_ipc_listen_before_write_cold_1();
LAB_001624bb:
    run_test_ipc_listen_before_write_cold_2();
  }
  else {
    if (remote_conn_accepted == '\0') goto LAB_001624bb;
    if (read_cb_called == 1) {
      if (exit_cb_called == 1) {
        return 0;
      }
      goto LAB_001624c5;
    }
  }
  run_test_ipc_listen_before_write_cold_3();
LAB_001624c5:
  run_test_ipc_listen_before_write_cold_4();
  spawn_helper(&channel,&uStack_a0,helper);
  uv_read_start(&channel,on_alloc,pcVar3);
  uVar2 = uv_default_loop();
  uVar4 = 0;
  iVar1 = uv_run(uVar2);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uVar4 = 0;
    uv_run(uVar2);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_ipc_test_cold_1();
  }
  run_ipc_test_cold_2();
  if (uVar4 != 0) {
    if (-1 < (long)uVar4) {
      on_read_cold_1();
      return extraout_EAX_00;
    }
    if (uVar4 != 0xfffffffffffff001) {
      uVar2 = uv_strerror(uVar4 & 0xffffffff);
      printf("error recving on channel: %s\n",uVar2);
      abort();
    }
  }
  free((void *)*extraout_RDX);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(ipc_listen_before_write) {
#if defined(NO_SEND_HANDLE_ON_PIPE)
  RETURN_SKIP(NO_SEND_HANDLE_ON_PIPE);
#endif
  int r = run_ipc_test("ipc_helper_listen_before_write", on_read);
  ASSERT(local_conn_accepted == 1);
  ASSERT(remote_conn_accepted == 1);
  ASSERT(read_cb_called == 1);
  ASSERT(exit_cb_called == 1);
  return r;
}